

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.h
# Opt level: O0

void __thiscall
TPZSYsmpMatrix<long_double>::CopyFrom(TPZSYsmpMatrix<long_double> *this,TPZMatrix<long_double> *mat)

{
  TPZSYsmpMatrix<long_double> *this_00;
  long in_RSI;
  TPZSYsmpMatrix<long_double> *from;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZSYsmpMatrix<long_double> *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 0) {
    this_00 = (TPZSYsmpMatrix<long_double> *)0x0;
  }
  else {
    this_00 = (TPZSYsmpMatrix<long_double> *)
              __dynamic_cast(in_RSI,&TPZMatrix<long_double>::typeinfo,&typeinfo,0);
  }
  if (this_00 == (TPZSYsmpMatrix<long_double> *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZSYsmpMatrix<long double>::CopyFrom(const TPZMatrix<TVar> *) [TVar = long double]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
    std::operator<<((ostream *)&std::cerr,"Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  else {
    operator=(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSYsmpMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }